

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_float32_primitive_printString
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  float fVar2;
  uint uVar3;
  sysbvm_object_tuple_t *floatObject;
  sysbvm_tuple_t sVar4;
  char buffer [32];
  char local_38 [40];
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  local_38[0x10] = '\0';
  local_38[0x11] = '\0';
  local_38[0x12] = '\0';
  local_38[0x13] = '\0';
  local_38[0x14] = '\0';
  local_38[0x15] = '\0';
  local_38[0x16] = '\0';
  local_38[0x17] = '\0';
  local_38[0x18] = '\0';
  local_38[0x19] = '\0';
  local_38[0x1a] = '\0';
  local_38[0x1b] = '\0';
  local_38[0x1c] = '\0';
  local_38[0x1d] = '\0';
  local_38[0x1e] = '\0';
  local_38[0x1f] = '\0';
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_38[8] = '\0';
  local_38[9] = '\0';
  local_38[10] = '\0';
  local_38[0xb] = '\0';
  local_38[0xc] = '\0';
  local_38[0xd] = '\0';
  local_38[0xe] = '\0';
  local_38[0xf] = '\0';
  uVar1 = *arguments;
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    fVar2 = *(float *)(uVar1 + 0x10);
  }
  else {
    fVar2 = (float)(uVar1 >> 4);
  }
  uVar3 = snprintf(local_38,0x20,"%g",(double)fVar2);
  if (-1 < (int)uVar3) {
    sVar4 = sysbvm_string_createWithString(context,(ulong)uVar3,local_38);
    return sVar4;
  }
  sVar4 = sysbvm_string_createEmptyWithSize(context,0);
  return sVar4;
}

Assistant:

static sysbvm_tuple_t sysbvm_float32_primitive_printString(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    char buffer[32] = {0};
    sysbvm_float32_t value = sysbvm_tuple_float32_decode(arguments[0]);

    int stringSize = snprintf(buffer, sizeof(buffer), "%g", value);
    if(stringSize < 0)
        return sysbvm_string_createEmptyWithSize(context, 0);
    else
        return sysbvm_string_createWithString(context, stringSize, buffer);
}